

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_parse_w(archive_acl *acl,wchar_t *text,wchar_t default_type)

{
  int iVar1;
  wchar_t wVar2;
  bool bVar3;
  wchar_t *local_a8;
  wchar_t *end;
  wchar_t *start;
  wchar_t local_90;
  wchar_t sep;
  wchar_t id;
  wchar_t permset;
  wchar_t tag;
  wchar_t type;
  wchar_t n;
  wchar_t fields;
  anon_struct_16_2_267fbce2 name;
  anon_struct_16_2_267fbce2 field [4];
  wchar_t *pwStack_20;
  wchar_t default_type_local;
  wchar_t *text_local;
  archive_acl *acl_local;
  
  field[3].end._4_4_ = default_type;
  pwStack_20 = text;
  text_local = (wchar_t *)acl;
  do {
    bVar3 = false;
    if (pwStack_20 != (wchar_t *)0x0) {
      bVar3 = *pwStack_20 != L'\0';
    }
    if (!bVar3) {
      return L'\0';
    }
    type = L'\0';
    do {
      next_field_w(&stack0xffffffffffffffe0,&end,&local_a8,(wchar_t *)((long)&start + 4));
      if (type < L'\x04') {
        field[(long)type + -1].end = end;
        field[type].start = local_a8;
      }
      type = type + L'\x01';
      wVar2 = type;
    } while (start._4_4_ == 0x3a);
    while (tag = wVar2, tag < L'\x04') {
      field[tag].start = (wchar_t *)0x0;
      field[(long)tag + -1].end = (wchar_t *)0x0;
      wVar2 = tag + L'\x01';
    }
    local_90 = L'\xffffffff';
    isint_w(field[0].end,field[1].start,&local_90);
    if ((local_90 == L'\xffffffff') && (L'\x03' < type)) {
      isint_w(field[2].end,field[3].start,&local_90);
    }
    if (((long)field[0].start - (long)name.end >> 2 < 8) ||
       (iVar1 = wmemcmp(name.end,anon_var_dwarf_6d0739,7), iVar1 != 0)) {
      permset = field[3].end._4_4_;
    }
    else {
      permset = L'Ȁ';
      name.end = name.end + 7;
    }
    name.start = (wchar_t *)0x0;
    _n = (wchar_t *)0x0;
    wVar2 = prefix_w(name.end,field[0].start,anon_var_dwarf_6d0750);
    if (wVar2 == L'\0') {
      wVar2 = prefix_w(name.end,field[0].start,anon_var_dwarf_6d0767);
      if (wVar2 == L'\0') {
        wVar2 = prefix_w(name.end,field[0].start,anon_var_dwarf_6d077e);
        if (wVar2 == L'\0') {
          wVar2 = prefix_w(name.end,field[0].start,anon_var_dwarf_6d0789);
          if (wVar2 == L'\0') {
            return L'\xffffffec';
          }
          if ((((type != L'\x02') || (field[1].start <= field[0].end)) ||
              (wVar2 = ismode_w(field[0].end,field[1].start,&sep), wVar2 == L'\0')) &&
             (((type != L'\x03' || (field[0].end != field[1].start)) ||
              ((field[2].start <= field[1].end ||
               (wVar2 = ismode_w(field[1].end,field[2].start,&sep), wVar2 == L'\0')))))) {
            return L'\xffffffec';
          }
          id = L'✕';
        }
        else {
          if ((((type != L'\x02') || (field[1].start <= field[0].end)) ||
              (wVar2 = ismode_w(field[0].end,field[1].start,&sep), wVar2 == L'\0')) &&
             ((((type != L'\x03' || (field[0].end != field[1].start)) ||
               (field[2].start <= field[1].end)) ||
              (wVar2 = ismode_w(field[1].end,field[2].start,&sep), wVar2 == L'\0')))) {
            return L'\xffffffec';
          }
          id = L'✖';
        }
      }
      else {
        wVar2 = ismode_w(field[1].end,field[2].start,&sep);
        if (wVar2 == L'\0') {
          return L'\xffffffec';
        }
        if ((local_90 == L'\xffffffff') && (field[1].start <= field[0].end)) {
          id = L'✔';
        }
        else {
          id = L'✓';
          _n = field[0].end;
          name.start = field[1].start;
        }
      }
    }
    else {
      wVar2 = ismode_w(field[1].end,field[2].start,&sep);
      if (wVar2 == L'\0') {
        return L'\xffffffec';
      }
      if ((local_90 == L'\xffffffff') && (field[1].start <= field[0].end)) {
        id = L'✒';
      }
      else {
        id = L'✑';
        _n = field[0].end;
        name.start = field[1].start;
      }
    }
    archive_acl_add_entry_w_len
              ((archive_acl *)text_local,permset,sep,id,local_90,_n,(long)name.start - (long)_n >> 2
              );
  } while( true );
}

Assistant:

int
archive_acl_parse_w(struct archive_acl *acl,
    const wchar_t *text, int default_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[4], name;

	int fields, n;
	int type, tag, permset, id;
	wchar_t sep;

	while (text != NULL  &&  *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint_w(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint_w(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && wmemcmp(field[0].start, L"default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_w(field[0].start, field[0].end, L"user")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"group")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_w(field[0].start, field[0].end, L"mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
	}
	return (ARCHIVE_OK);
}